

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  PyMethodDef *pPVar5;
  PyObject *pPVar6;
  pointer paVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  type_info *find_type;
  long lVar12;
  internals *piVar13;
  handle hVar14;
  undefined8 *puVar15;
  long *plVar16;
  function_record *pfVar17;
  object *poVar18;
  ushort uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  PyObject *tmp;
  instance *piVar23;
  PyTypeObject *pPVar24;
  size_type __new_size;
  uint __len;
  function_record *pfVar25;
  uint __uval;
  ulong uVar26;
  Py_ssize_t *pPVar27;
  ulong uVar28;
  ulong uVar29;
  function_record *pfVar30;
  bool bVar31;
  handle arg;
  tuple extra_args;
  loader_life_support guard_1;
  dict kwargs_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  instance *pi;
  undefined1 local_1c8 [24];
  object oStack_1b0;
  PyMethodDef *local_1a8;
  function_record *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  PyMethodDef *local_178;
  instance *local_170;
  function_record *local_168;
  undefined1 local_160 [8];
  undefined1 auStack_158 [16];
  pointer paStack_148;
  anon_union_24_2_63b86169_for_instance_1 local_140;
  handle hStack_128;
  PyMethodDef *local_120;
  handle hStack_118;
  handle local_110;
  handle local_108;
  handle local_100;
  PyObject *local_f8;
  handle local_f0;
  undefined1 local_e8 [32];
  handle local_c8;
  long local_c0;
  PyObject local_b8;
  PyTypeObject *local_a8;
  ulong local_a0;
  ulong local_98;
  void *local_88;
  ulong local_80;
  instance *local_78;
  pointer phStack_70;
  type_info *local_68;
  pointer paStack_60;
  handle local_58;
  pointer local_50;
  _object *local_40;
  _object *local_38;
  
  local_170 = (instance *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                  ,0x227,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_98 = args_in[1].ob_refcnt;
  if (local_98 == 0) {
    local_a8 = (PyTypeObject *)0x0;
  }
  else {
    local_a8 = args_in[1].ob_type;
  }
  local_68 = (type_info *)0x0;
  paStack_60 = (pointer)0x0;
  local_78 = (instance *)0x0;
  phStack_70 = (pointer)0x0;
  if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 1) != 0) {
    pPVar24 = (PyTypeObject *)local_170[2].ob_base.ob_refcnt;
    if ((local_a8->ob_base).ob_base.ob_type != pPVar24) {
      iVar10 = PyType_IsSubtype();
      if (iVar10 == 0) {
        PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
        return (PyObject *)0x0;
      }
      pPVar24 = (PyTypeObject *)local_170[2].ob_base.ob_refcnt;
    }
    find_type = detail::get_type_info(pPVar24);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_160,(instance *)local_a8,find_type,true);
    local_68 = (type_info *)auStack_158._8_8_;
    paStack_60 = paStack_148;
    local_78 = (instance *)local_160;
    phStack_70 = (pointer)auStack_158._0_8_;
    bVar9 = (byte)((PyObject *)((long)local_160 + 0x30))->ob_refcnt;
    if ((bVar9 & 2) == 0) {
      bVar9 = *(byte *)((long)&(((PyObject *)((long)local_160 + 0x10))->ob_type->ob_base).ob_base.
                               ob_refcnt + (long)(PyObject **)auStack_158._0_8_) & 2;
    }
    else {
      bVar9 = bVar9 >> 3 & 1;
    }
    if (bVar9 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_160 = (undefined1  [8])0x0;
      object::~object((object *)local_160);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_e8._0_8_ = (PyObject *)0x0;
  local_e8._8_8_ = (function_record *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_88 = local_170[2].field_1.simple_value_holder[0];
  local_50 = (pointer)&args_in[1].ob_type;
  local_f8 = (PyObject *)0x1;
  hVar14.m_ptr = &local_170->ob_base;
  local_1a0 = (function_record *)args_in;
  local_168 = (function_record *)kwargs_in;
  do {
    uVar19 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
    uVar22 = (uVar19 & 0x20) >> 5;
    local_80 = (long)(short)((uint)(int)(short)(uVar19 << 9) >> 0xf) +
               ((ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4) - (ulong)uVar22);
    uVar20 = local_80 - *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 6);
    if (((uVar22 != 0) || (local_98 <= uVar20)) &&
       ((local_a0 = uVar20, uVar20 <= local_98 ||
        (uVar20 <= (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)hVar14.m_ptr[1].ob_type >> 5))))) {
      local_140.simple_value_holder[2] = (function_record *)0x0;
      hStack_128.m_ptr = hStack_128.m_ptr & 0xffffffff00000000;
      local_140.simple_value_holder[1] =
           (void *)((ulong)local_140.simple_value_holder[1] & 0xffffffff00000000);
      paStack_148 = (pointer)0x0;
      local_140.simple_value_holder[0] = (function_record *)0x0;
      auStack_158._0_8_ = (pointer)0x0;
      auStack_158._8_8_ = (type_info *)0x0;
      local_110.m_ptr = (PyObject *)0x0;
      local_120 = (PyMethodDef *)0x0;
      hStack_118.m_ptr = (PyObject *)0x0;
      local_108.m_ptr = (PyObject *)local_a8;
      local_100.m_ptr = (PyObject *)0x0;
      local_160 = (undefined1  [8])hVar14.m_ptr;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_158,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      uVar20 = local_a0;
      if (local_98 < local_a0) {
        uVar20 = local_98;
      }
      if (((ulong)hVar14.m_ptr[5].ob_type & 0x200) == 0) {
        uVar28 = 0;
      }
      else {
        if (*(PyObject **)&paStack_60->field_0x0 != (PyObject *)0x0) {
          (*local_68->dealloc)((value_and_holder *)&stack0xffffffffffffff88);
        }
        if ((((PyTypeObject *)
             (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
              &((function_record *)args_in)->doc)->
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                        ,0x274,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_100.m_ptr =
             *(PyObject **)
              &(((function_record *)args_in)->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data;
        local_1c8._0_8_ = &stack0xffffffffffffff88;
        if ((pointer)auStack_158._8_8_ == paStack_148) {
          std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
          _M_realloc_insert<_object*>
                    ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                     (iterator)auStack_158._8_8_,(_object **)local_1c8);
        }
        else {
          *(PyObject **)auStack_158._8_8_ = (PyObject *)local_1c8._0_8_;
          auStack_158._8_8_ = auStack_158._8_8_ + 8;
        }
        uVar28 = 1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,false);
      }
      uVar29 = uVar28;
      if (uVar28 < uVar20) {
        uVar26 = (ulong)(uint)((int)uVar28 << 5);
        do {
          pPVar24 = hVar14.m_ptr[1].ob_type;
          if (uVar28 < (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)pPVar24 >> 5)) {
            plVar16 = (long *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt + uVar26);
            bVar31 = pPVar24 != (PyTypeObject *)0x0;
            if ((((local_168 != (function_record *)0x0) && (pPVar24 != (PyTypeObject *)0x0)) &&
                (bVar31 = true, *plVar16 != 0)) &&
               (lVar12 = PyDict_GetItemString(local_168), lVar12 != 0)) {
LAB_0010e5a5:
              bVar31 = false;
              args_in = (PyObject *)local_1a0;
              goto LAB_0010e907;
            }
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_1a0->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0010f69a;
            local_1c8._0_8_ = local_1a0->data[uVar28 - 4];
            if (bVar31) {
              bVar31 = true;
              if (((*(byte *)((long)&pPVar24->tp_name + uVar26) & 2) == 0) &&
                 ((function_record *)local_1c8._0_8_ == (function_record *)&_Py_NoneStruct))
              goto LAB_0010e5a5;
            }
            else {
              bVar31 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_1a0->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0010f69a:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                            ,0x283,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1c8._0_8_ = local_1a0->data[uVar28 - 4];
            bVar31 = false;
            plVar16 = (long *)0x0;
          }
          if ((pointer)auStack_158._8_8_ == paStack_148) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                       (iterator)auStack_158._8_8_,(handle *)local_1c8);
          }
          else {
            *(PyObject **)auStack_158._8_8_ = (PyObject *)local_1c8._0_8_;
            auStack_158._8_8_ = auStack_158._8_8_ + 8;
          }
          bVar9 = 1;
          if (bVar31) {
            bVar9 = *(byte *)(plVar16 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,(bool)(bVar9 & 1));
          uVar28 = uVar28 + 1;
          uVar26 = uVar26 + 0x20;
          uVar29 = uVar20;
        } while (uVar20 != uVar28);
      }
      local_c8.m_ptr = (PyObject *)local_168;
      if (local_168 != (function_record *)0x0) {
        local_168->name = (char *)((long)&((function_record *)local_168->name)->name + 1);
      }
      uVar28 = (ulong)*(ushort *)&hVar14.m_ptr[6].ob_refcnt;
      if (uVar29 < uVar28) {
        lVar12 = uVar29 * 0x20;
        local_1c8._0_8_ = *(undefined8 *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar12 + 0x10)
        ;
        if ((function_record *)local_1c8._0_8_ != (function_record *)0x0) {
          pPVar27 = (Py_ssize_t *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar12);
          lVar12 = lVar12 + 0x30;
          uVar26 = uVar29;
          do {
            if ((pointer)auStack_158._8_8_ == paStack_148) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                         (iterator)auStack_158._8_8_,(handle *)local_1c8);
            }
            else {
              *(PyObject **)auStack_158._8_8_ = (PyObject *)local_1c8._0_8_;
              auStack_158._8_8_ = auStack_158._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,
                       (bool)((byte)pPVar27[3] & 1));
            uVar29 = uVar26 + 1;
            uVar19 = *(ushort *)&hVar14.m_ptr[6].ob_refcnt;
            uVar28 = (ulong)uVar19;
            uVar21 = (ulong)uVar19;
            if (uVar19 <= uVar29) goto LAB_0010e35f;
            pPVar27 = &(hVar14.m_ptr[1].ob_type)->tp_basicsize + uVar26 * 4;
            local_1c8._0_8_ =
                 *(undefined8 *)
                  ((long)&((hVar14.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar12);
            lVar12 = lVar12 + 0x20;
            uVar26 = uVar29;
          } while ((function_record *)local_1c8._0_8_ != (function_record *)0x0);
        }
        local_1c8._0_8_ = (function_record *)0x0;
        uVar21 = uVar28;
LAB_0010e35f:
        if (uVar21 <= uVar29) goto LAB_0010e37e;
LAB_0010e4db:
        bVar31 = false;
        args_in = (PyObject *)local_1a0;
      }
      else {
LAB_0010e37e:
        if (uVar29 < local_80) {
          uVar26 = uVar29 << 5 | 0x18;
          bVar31 = false;
          uVar28 = local_80;
          do {
            pPVar24 = hVar14.m_ptr[1].ob_type;
            local_1c8._0_8_ = (function_record *)0x0;
            if (((local_168 == (function_record *)0x0) ||
                (*(long *)((long)pPVar24 + (uVar26 - 0x18)) == 0)) ||
               (local_1c8._0_8_ = PyDict_GetItemString(local_c8.m_ptr),
               (function_record *)local_1c8._0_8_ == (function_record *)0x0)) {
              pfVar25 = *(function_record **)((long)pPVar24 + (uVar26 - 8));
              if (pfVar25 != (function_record *)0x0) {
                local_1c8._0_8_ = pfVar25;
              }
            }
            else {
              if (!bVar31) {
                local_198._0_8_ = PyDict_Copy(local_c8.m_ptr);
                object::operator=((object *)&local_c8,(object *)local_198);
                object::~object((object *)local_198);
                uVar28 = local_80;
              }
              bVar31 = true;
              PyDict_DelItemString(local_c8.m_ptr,*(undefined8 *)((long)pPVar24 + (uVar26 - 0x18)));
            }
            if (((*(byte *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt + uVar26) & 2) == 0 &&
                 (function_record *)local_1c8._0_8_ == (function_record *)&_Py_NoneStruct) ||
               ((function_record *)local_1c8._0_8_ == (function_record *)0x0)) {
              bVar31 = false;
              args_in = (PyObject *)local_1a0;
              goto LAB_0010e8fa;
            }
            if ((pointer)auStack_158._8_8_ == paStack_148) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                         (iterator)auStack_158._8_8_,(handle *)local_1c8);
            }
            else {
              *(PyObject **)auStack_158._8_8_ = (PyObject *)local_1c8._0_8_;
              auStack_158._8_8_ = auStack_158._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,
                       (bool)(*(byte *)((long)&(pPVar24->ob_base).ob_base.ob_refcnt + uVar26) & 1));
            uVar29 = uVar29 + 1;
            uVar26 = uVar26 + 0x20;
          } while (uVar29 < uVar28);
        }
        if ((function_record *)local_c8.m_ptr == (function_record *)0x0) {
          uVar19 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        else {
          lVar12 = PyDict_Size();
          uVar19 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
          if ((lVar12 != 0) && ((uVar19 & 0x40) == 0)) goto LAB_0010e4db;
        }
        args_in = (PyObject *)local_1a0;
        if ((uVar19 & 0x20) != 0) {
          tuple::tuple((tuple *)local_198,0);
          if (uVar20 == 0) {
            ((function_record *)args_in)->name =
                 (char *)((long)&((function_record *)((function_record *)args_in)->name)->name + 1);
            local_1c8._0_8_ = args_in;
LAB_0010e5c6:
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          else {
            pfVar25 = (function_record *)(local_98 - uVar29);
            if (local_98 < uVar29 || pfVar25 == (function_record *)0x0) {
              tuple::tuple((tuple *)local_1c8,0);
              goto LAB_0010e5c6;
            }
            tuple::tuple((tuple *)local_1c8,(size_t)pfVar25);
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
            paVar7 = local_50;
            pfVar17 = (function_record *)0x0;
            do {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                    &((function_record *)args_in)->doc)->
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                              ,0x2dc,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1c8._8_8_ = local_198._0_8_;
              oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1c8._16_8_ = pfVar17;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_198._0_8_,(size_t)pfVar17,
                         *(PyObject **)(paVar7 + (long)((long)&pfVar17->name + uVar29) * 8));
              object::~object((object *)(local_1c8 + 0x18));
              pfVar17 = (function_record *)((long)&pfVar17->name + 1);
            } while (pfVar25 != pfVar17);
          }
          if ((pointer)auStack_158._8_8_ == paStack_148) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                       (iterator)auStack_158._8_8_,(handle *)local_198);
          }
          else {
            *(PyObject **)auStack_158._8_8_ = (PyObject *)local_198._0_8_;
            auStack_158._8_8_ = auStack_158._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,false);
          object::operator=((object *)&hStack_118,(object *)local_198);
          object::~object((object *)local_198);
          uVar19 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        if ((uVar19 & 0x40) != 0) {
          if ((function_record *)local_c8.m_ptr == (function_record *)0x0) {
            dict::dict((dict *)local_1c8);
            object::operator=((object *)&local_c8,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          if ((pointer)auStack_158._8_8_ == paStack_148) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_158,
                       (iterator)auStack_158._8_8_,&local_c8);
          }
          else {
            *(PyObject **)auStack_158._8_8_ = local_c8.m_ptr;
            auStack_158._8_8_ = auStack_158._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_140.nonsimple,false);
          object::operator=((object *)&local_110,(object *)&local_c8);
        }
        __new_size = (long)(auStack_158._8_8_ - auStack_158._0_8_) >> 3;
        if ((__new_size != *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4)) ||
           (((ulong)hStack_128.m_ptr & 0xffffffff) +
            ((long)local_140.simple_value_holder[2] - local_140._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_198._0_8_ = (PyObject *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188._0_8_ = (function_record *)0x0;
        local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
        local_178 = (PyMethodDef *)0x0;
        if (local_88 != (void *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_198,__new_size,false);
          pPVar5 = local_120;
          hVar4.m_ptr = hStack_128.m_ptr;
          uVar3 = local_140.simple_value_holder[2];
          uVar2 = local_140.simple_value_holder[1];
          uVar1 = local_140.simple_value_holder[0];
          local_1a8 = local_120;
          local_1c8._16_8_ = local_140.simple_value_holder[2];
          oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_128.m_ptr;
          local_1c8._0_8_ = local_140.simple_value_holder[0];
          local_1c8._8_8_ = local_140.simple_value_holder[1];
          local_120 = local_178;
          local_140.simple_value_holder[2] = (void *)local_188._0_8_;
          hStack_128.m_ptr = (PyObject *)local_188._8_8_;
          local_140.simple_value_holder[0] = (void *)local_198._0_8_;
          local_140.simple_value_holder[1] = (void *)local_198._8_8_;
          local_178 = pPVar5;
          local_188._0_8_ = uVar3;
          local_188._8_8_ = hVar4.m_ptr;
          local_198._0_8_ = uVar1;
          local_198._8_8_ = uVar2;
        }
        piVar13 = detail::get_internals();
        local_40 = (_object *)0x0;
        std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                  ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                   &stack0xffffffffffffffc0);
        local_f8 = (PyObject *)(*(code *)hVar14.m_ptr[3].ob_refcnt)(local_160);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1c8);
        pPVar5 = local_120;
        hVar4.m_ptr = hStack_128.m_ptr;
        uVar3 = local_140.simple_value_holder[2];
        uVar2 = local_140.simple_value_holder[1];
        uVar1 = local_140.simple_value_holder[0];
        bVar31 = local_f8 != (PyObject *)0x1;
        if (local_88 != (void *)0x0 && !bVar31) {
          for (uVar20 = (ulong)(*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1) >> 4 & 1);
              uVar20 < local_a0; uVar20 = uVar20 + 1) {
            uVar28 = uVar20 + 0x3f;
            if (-1 < (long)uVar20) {
              uVar28 = uVar20;
            }
            if ((*(ulong *)(local_198._0_8_ +
                           (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar28 >> 6) * 8 + -8) >> (uVar20 & 0x3f) & 1) != 0) {
              local_1a8 = local_120;
              local_1c8._16_8_ = local_140.simple_value_holder[2];
              oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_128.m_ptr;
              local_1c8._0_8_ = local_140.simple_value_holder[0];
              local_1c8._8_8_ = local_140.simple_value_holder[1];
              local_120 = local_178;
              local_140.simple_value_holder[2] = (void *)local_188._0_8_;
              hStack_128.m_ptr = (PyObject *)local_188._8_8_;
              local_140.simple_value_holder[0] = (void *)local_198._0_8_;
              local_140.simple_value_holder[1] = (void *)local_198._8_8_;
              local_178 = pPVar5;
              local_188._0_8_ = uVar3;
              local_188._8_8_ = hVar4.m_ptr;
              local_198._0_8_ = uVar1;
              local_198._8_8_ = uVar2;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_e8,(function_call *)local_160);
              break;
            }
          }
          bVar31 = false;
        }
        if ((function_record *)local_198._0_8_ != (function_record *)0x0) {
          operator_delete((void *)local_198._0_8_,(long)local_178 - local_198._0_8_);
        }
      }
LAB_0010e8fa:
      object::~object((object *)&local_c8);
LAB_0010e907:
      object::~object((object *)&local_110);
      object::~object((object *)&hStack_118);
      if ((function_record *)local_140.simple_value_holder[0] != (function_record *)0x0) {
        operator_delete(local_140.simple_value_holder[0],(long)local_120 - local_140._0_8_);
        local_140.simple_value_holder[0] = (function_record *)0x0;
        local_140.simple_value_holder[1] =
             (void *)((ulong)local_140.simple_value_holder[1] & 0xffffffff00000000);
        local_140.simple_value_holder[2] = (function_record *)0x0;
        hStack_128.m_ptr = hStack_128.m_ptr & 0xffffffff00000000;
        local_120 = (PyMethodDef *)0x0;
      }
      if ((pointer)auStack_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_158._0_8_,(long)paStack_148 - auStack_158._0_8_);
      }
      if (bVar31) break;
    }
    hVar14.m_ptr = (PyObject *)hVar14.m_ptr[8].ob_refcnt;
  } while ((instance *)hVar14.m_ptr != (instance *)0x0);
  uVar1 = local_e8._8_8_;
  if ((local_88 == (void *)0x0) || (local_e8._0_8_ == local_e8._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_e8);
    if (local_f8 != (PyObject *)0x1) goto LAB_0010eb08;
  }
  else {
    hVar14.m_ptr = local_f8;
    if (local_f8 != (PyObject *)0x1) {
LAB_0010eaf3:
      local_f8 = hVar14.m_ptr;
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_e8);
LAB_0010eb08:
      pPVar6 = local_f8;
      if (local_f8 != (PyObject *)0x0) {
        if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 1) == 0) {
          return local_f8;
        }
        if ((local_78->field_0x30 & 2) == 0) {
          bVar9 = (local_78->field_1).nonsimple.status[(long)phStack_70];
        }
        else {
          bVar9 = (byte)local_78->field_0x30 >> 2;
        }
        if ((bVar9 & 1) == 0) {
          (*local_68->init_instance)((instance *)local_a8,(void *)0x0);
          return pPVar6;
        }
        return local_f8;
      }
      local_160 = (undefined1  [8])(auStack_158 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 "");
      std::__cxx11::string::append(local_160);
      lVar12 = std::__cxx11::string::find(local_160,0x181fc6,0);
      if (lVar12 != -1) {
        std::__cxx11::string::append(local_160);
      }
      PyErr_SetString(_PyExc_TypeError,local_160);
      if (local_160 == (undefined1  [8])(auStack_158 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_0010f676;
    }
    pfVar25 = (function_record *)local_e8._0_8_;
    do {
      piVar13 = detail::get_internals();
      local_38 = (_object *)0x0;
      std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                 &stack0xffffffffffffffc8);
      hVar14 = (*((function_record *)pfVar25->name)->impl)((function_call *)pfVar25);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_160);
      if (hVar14.m_ptr != (PyObject *)0x1) goto LAB_0010eaf3;
      pfVar25 = (function_record *)&pfVar25->def;
    } while (pfVar25 != (function_record *)uVar1);
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_e8);
  }
  if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 8) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,(char *)(local_170->ob_base).ob_refcnt,(allocator<char> *)&local_f0)
  ;
  puVar15 = (undefined8 *)std::__cxx11::string::append(local_e8);
  local_198._0_8_ = local_188;
  pfVar25 = (function_record *)(puVar15 + 2);
  if ((function_record *)*puVar15 == pfVar25) {
    local_188._0_8_ = pfVar25->name;
    local_188._8_8_ = puVar15[3];
  }
  else {
    local_188._0_8_ = pfVar25->name;
    local_198._0_8_ = (PyObject *)*puVar15;
  }
  local_198._8_8_ = puVar15[1];
  *puVar15 = pfVar25;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  uVar19 = *(ushort *)((long)&local_170[1].field_1 + 0x11);
  iVar10 = 0x181d53;
  if ((uVar19 & 1) != 0) {
    iVar10 = 0x181d47;
  }
  local_c8.m_ptr = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,iVar10,iVar10 + (uVar19 & 1) * 3 + 8);
  pfVar25 = (function_record *)((long)(function_record **)local_198._8_8_ + local_c0);
  pfVar17 = (function_record *)0xf;
  if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
    pfVar17 = (function_record *)local_188._0_8_;
  }
  if (pfVar17 < pfVar25) {
    pfVar17 = (function_record *)0xf;
    if (local_c8.m_ptr != &local_b8) {
      pfVar17 = (function_record *)local_b8.ob_refcnt;
    }
    if (pfVar17 < pfVar25) goto LAB_0010ed1d;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_198._0_8_);
  }
  else {
LAB_0010ed1d:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_198,(ulong)local_c8.m_ptr);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  pfVar25 = (function_record *)(puVar15 + 2);
  if ((function_record *)*puVar15 == pfVar25) {
    local_1c8._16_8_ = pfVar25->name;
    oStack_1b0.super_handle.m_ptr = (handle)puVar15[3];
  }
  else {
    local_1c8._16_8_ = pfVar25->name;
    local_1c8._0_8_ = (function_record *)*puVar15;
  }
  local_1c8._8_8_ = puVar15[1];
  *puVar15 = pfVar25;
  puVar15[1] = 0;
  *(undefined1 *)&pfVar25->name = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_1c8);
  local_160 = (undefined1  [8])(auStack_158 + 8);
  piVar23 = (instance *)(plVar16 + 2);
  if ((instance *)*plVar16 == piVar23) {
    auStack_158._8_8_ = (piVar23->ob_base).ob_refcnt;
    paStack_148 = (pointer)plVar16[3];
  }
  else {
    auStack_158._8_8_ = (piVar23->ob_base).ob_refcnt;
    local_160 = (undefined1  [8])*plVar16;
  }
  auStack_158._0_8_ = plVar16[1];
  *plVar16 = (long)piVar23;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if (local_c8.m_ptr != &local_b8) {
    operator_delete(local_c8.m_ptr,(ulong)((long)(char **)local_b8.ob_refcnt + 1));
  }
  if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  if ((function_record *)local_e8._0_8_ != (function_record *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)((long)(function_record **)local_e8._16_8_ + 1));
  }
  piVar23 = local_170;
  uVar22 = 0;
  do {
    __val = uVar22 + 1;
    __len = 1;
    if (8 < uVar22) {
      uVar20 = (ulong)__val;
      uVar22 = 4;
      do {
        __len = uVar22;
        uVar11 = (uint)uVar20;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_0010eebb;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_0010eebb;
        }
        if (uVar11 < 10000) goto LAB_0010eebb;
        uVar20 = uVar20 / 10000;
        uVar22 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_0010eebb:
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_e8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8._0_8_,__len,__val);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x18282f);
    local_198._0_8_ = local_188;
    pfVar25 = (function_record *)(puVar15 + 2);
    if ((function_record *)*puVar15 == pfVar25) {
      local_188._0_8_ = pfVar25->name;
      local_188._8_8_ = puVar15[3];
    }
    else {
      local_188._0_8_ = pfVar25->name;
      local_198._0_8_ = (PyObject *)*puVar15;
    }
    local_198._8_8_ = puVar15[1];
    *puVar15 = pfVar25;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_198);
    local_1c8._0_8_ = local_1c8 + 0x10;
    pfVar25 = (function_record *)(puVar15 + 2);
    if ((function_record *)*puVar15 == pfVar25) {
      local_1c8._16_8_ = pfVar25->name;
      oStack_1b0.super_handle.m_ptr = (handle)puVar15[3];
    }
    else {
      local_1c8._16_8_ = pfVar25->name;
      local_1c8._0_8_ = (function_record *)*puVar15;
    }
    local_1c8._8_8_ = puVar15[1];
    *puVar15 = pfVar25;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_160,local_1c8._0_8_);
    if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    if ((function_record *)local_e8._0_8_ != (function_record *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,(ulong)((long)(function_record **)local_e8._16_8_ + 1))
      ;
    }
    if ((*(byte *)((long)&local_170[1].field_1 + 0x11) & 1) == 0) {
LAB_0010f148:
      std::__cxx11::string::append((char *)local_160);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,(char *)(piVar23->field_1).simple_value_holder[0],
                 (allocator<char> *)local_198);
      lVar12 = std::__cxx11::string::find((char)(string *)local_1c8,0x28);
      pfVar25 = (function_record *)(lVar12 + 7);
      if ((ulong)local_1c8._8_8_ <= pfVar25) {
LAB_0010f12c:
        if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        goto LAB_0010f148;
      }
      pfVar17 = (function_record *)std::__cxx11::string::find(local_1c8,0x1818f8,0);
      std::__cxx11::string::rfind(local_1c8,0x181d95,0xffffffffffffffff);
      if (pfVar17 < (ulong)local_1c8._8_8_) {
        pfVar30 = (function_record *)((long)&pfVar17->name + 2);
      }
      else {
        pfVar17 = (function_record *)std::__cxx11::string::find((char)local_1c8,0x29);
        pfVar30 = pfVar17;
      }
      if ((pfVar17 <= pfVar25) || ((ulong)local_1c8._8_8_ <= pfVar30)) goto LAB_0010f12c;
      std::__cxx11::string::append((string *)local_160,(ulong)local_1c8,(ulong)pfVar25);
      std::__cxx11::string::push_back((char)(string *)local_160);
      std::__cxx11::string::append((string *)local_160,(ulong)local_1c8,(ulong)pfVar30);
      if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_160);
    piVar23 = (instance *)piVar23[2].field_1.simple_value_holder[0];
    uVar22 = __val;
  } while (piVar23 != (instance *)0x0);
  std::__cxx11::string::append(local_160);
  local_c8.m_ptr = (PyObject *)local_1a0;
  if (local_1a0 != (function_record *)0x0) {
    local_1a0->name = (char *)((long)&((function_record *)local_1a0->name)->name + 1);
  }
  bVar31 = false;
  for (pfVar25 = (function_record *)(ulong)(*(ushort *)((long)&local_170[1].field_1 + 0x11) & 1);
      pfVar17 = (function_record *)PyTuple_Size(local_c8.m_ptr), pfVar25 < pfVar17;
      pfVar25 = (function_record *)((long)&pfVar25->name + 1)) {
    bVar8 = true;
    if (bVar31) {
      std::__cxx11::string::append(local_160);
      bVar8 = bVar31;
    }
    bVar31 = bVar8;
    local_198._8_8_ = local_c8.m_ptr;
    local_188._8_8_ = (PyObject *)0x0;
    local_188._0_8_ = pfVar25;
    poVar18 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_198);
    local_f0.m_ptr = (poVar18->super_handle).m_ptr;
    if ((function_record *)local_f0.m_ptr != (function_record *)0x0) {
      ((function_record *)local_f0.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_f0.m_ptr)->name)->name + 1)
      ;
    }
    hVar14.m_ptr = (PyObject *)PyObject_Repr(local_f0.m_ptr);
    if ((function_record *)hVar14.m_ptr == (function_record *)0x0) {
      local_1a0 = (function_record *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set((error_already_set *)local_1a0);
      __cxa_throw(local_1a0,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_e8._0_8_ = hVar14.m_ptr;
    str::operator_cast_to_string((string *)local_1c8,(str *)local_e8);
    std::__cxx11::string::_M_append(local_160,local_1c8._0_8_);
    if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    object::~object((object *)local_e8);
    object::~object((object *)&local_f0);
    object::~object((object *)(local_188 + 8));
  }
  if (local_168 != (function_record *)0x0) {
    local_f0.m_ptr = (PyObject *)local_168;
    local_168->name = (char *)((long)&((function_record *)local_168->name)->name + 1);
    lVar12 = PyDict_Size();
    if (lVar12 != 0) {
      if (bVar31) {
        std::__cxx11::string::append(local_160);
      }
      std::__cxx11::string::append(local_160);
      local_1c8._0_8_ = local_f0.m_ptr;
      local_1c8._8_8_ = (function_record *)0x0;
      local_1c8._16_8_ = (function_record *)0x0;
      oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next(local_f0.m_ptr,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
      if ((iVar10 != 0) && (oStack_1b0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
        local_e8._0_8_ = local_1c8._8_8_;
        local_e8._8_8_ = local_1c8._16_8_;
        while( true ) {
          str::str((str *)&stack0xffffffffffffffb8,"{}=");
          str::format<pybind11::handle&>
                    ((str *)&stack0xffffffffffffffa8,(handle *)&stack0xffffffffffffffb8);
          str::operator_cast_to_string((string *)local_198,(str *)&stack0xffffffffffffffa8);
          std::__cxx11::string::_M_append(local_160,local_198._0_8_);
          if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
          object::~object((object *)&stack0xffffffffffffffa8);
          object::~object((object *)&stack0xffffffffffffffb8);
          hVar14.m_ptr = (PyObject *)PyObject_Repr(local_e8._8_8_);
          if (hVar14.m_ptr == (PyObject *)0x0) {
            local_168 = (function_record *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set((error_already_set *)local_168);
            __cxa_throw(local_168,&error_already_set::typeinfo,error_already_set::~error_already_set
                       );
          }
          local_58.m_ptr = hVar14.m_ptr;
          str::operator_cast_to_string((string *)local_198,(str *)&stack0xffffffffffffffa8);
          std::__cxx11::string::_M_append(local_160,local_198._0_8_);
          if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
          object::~object((object *)&stack0xffffffffffffffa8);
          iVar10 = PyDict_Next(local_1c8._0_8_,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
          if ((iVar10 == 0) || (oStack_1b0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
          break;
          local_e8._0_8_ = local_1c8._8_8_;
          local_e8._8_8_ = local_1c8._16_8_;
          std::__cxx11::string::append(local_160);
        }
      }
    }
    object::~object((object *)&local_f0);
  }
  lVar12 = std::__cxx11::string::find(local_160,0x181fc6,0);
  if (lVar12 != -1) {
    std::__cxx11::string::append(local_160);
  }
  PyErr_SetString(_PyExc_TypeError,local_160);
  object::~object((object *)&local_c8);
  if (local_160 == (undefined1  [8])(auStack_158 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010f676:
  operator_delete((void *)local_160,(ulong)((long)(PyTypeObject **)auStack_158._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg_rec.name);
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }